

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O2

BtorSimBitVector * btorsim_bv_redand(BtorSimBitVector *bv)

{
  BtorSimBitVector *bv_00;
  uint uVar1;
  ulong uVar2;
  bool bVar3;
  
  bv_00 = btorsim_bv_new(1);
  uVar1 = 0xffffffff;
  if ((ulong)bv->len << 5 != (ulong)bv->width) {
    uVar1 = 0x7fffffff >> (~(byte)bv->width & 0x1f);
  }
  bVar3 = bv[1].width == uVar1;
  for (uVar2 = 1; (bVar3 != false && (uVar2 < bv->len)); uVar2 = uVar2 + 1) {
    bVar3 = (&bv[1].width)[uVar2] == 0xffffffff;
  }
  btorsim_bv_set_bit(bv_00,0,(uint)bVar3);
  return bv_00;
}

Assistant:

BtorSimBitVector *
btorsim_bv_redand (const BtorSimBitVector *bv)
{
  assert (bv);

  uint32_t i;
  uint32_t bit;
  uint32_t mask0;
  BtorSimBitVector *res;

  res = btorsim_bv_new (1);
  assert (rem_bits_zero_dbg (res));

  if (bv->width == BTORSIM_BV_TYPE_BW * bv->len)
    mask0 = ~(BTORSIM_BV_TYPE) 0;
  else
    mask0 = BTOR2_MASK_REM_BITS (bv);

  bit = (bv->bits[0] == mask0);

  for (i = 1; bit && i < bv->len; i++)
    if (bv->bits[i] != ~(BTORSIM_BV_TYPE) 0) bit = 0;

  btorsim_bv_set_bit (res, 0, bit);

  assert (rem_bits_zero_dbg (res));
  return res;
}